

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::Expression(SQCompiler *this)

{
  ulong uVar1;
  long tok;
  ulong etype;
  SQUnsignedInteger SVar2;
  SQUnsignedInteger SVar3;
  SQUnsignedInteger SVar4;
  SQInteger SVar5;
  SQInteger SVar6;
  bool bVar7;
  undefined7 uVar8;
  SQInteger SVar9;
  SQInteger SVar10;
  SQInteger arg2;
  SQOpcode SVar11;
  char *s;
  SQFuncState *pSVar12;
  SQExpState es;
  
  bVar7 = (this->_es).donot_get;
  uVar8 = *(undefined7 *)&(this->_es).field_0x11;
  SVar5 = (this->_es).etype;
  SVar6 = (this->_es).epos;
  (this->_es).etype = 1;
  (this->_es).epos = -1;
  (this->_es).donot_get = false;
  LogicalOrExp(this);
  tok = this->_token;
  uVar1 = tok - 0x119;
  if ((0x26 < uVar1) || ((0x7000000301U >> (uVar1 & 0x3f) & 1) == 0)) {
    if (tok == 0x3f) {
      Lex(this);
      pSVar12 = this->_fs;
      SVar9 = SQFuncState::PopTarget(pSVar12);
      SQFuncState::AddInstruction(pSVar12,_OP_JZ,SVar9,0,0,0);
      SVar2 = (this->_fs->_instructions)._size;
      SVar9 = SQFuncState::PushTarget(this->_fs,-1);
      Expression(this);
      SVar10 = SQFuncState::PopTarget(this->_fs);
      if (SVar9 != SVar10) {
        SQFuncState::AddInstruction(this->_fs,_OP_MOVE,SVar9,SVar10,0,0);
      }
      SVar3 = (this->_fs->_instructions)._size;
      SQFuncState::AddInstruction(this->_fs,_OP_JMP,0,0,0,0);
      Expect(this,0x3a);
      SVar4 = (this->_fs->_instructions)._size;
      Expression(this);
      SVar10 = SQFuncState::PopTarget(this->_fs);
      if (SVar9 != SVar10) {
        SQFuncState::AddInstruction(this->_fs,_OP_MOVE,SVar9,SVar10,0,0);
      }
      SQFuncState::SetInstructionParam
                (this->_fs,SVar4 - 1,1,(this->_fs->_instructions)._size - SVar4);
      SQFuncState::SetInstructionParam(this->_fs,SVar2 - 1,1,(SVar3 - SVar2) + 1);
      this->_fs->_optimization = false;
      goto LAB_0011d9e6;
    }
    if (tok != 0x3d) goto LAB_0011d9e6;
  }
  etype = (this->_es).etype;
  SVar9 = (this->_es).epos;
  if (etype == 1) {
    s = "can\'t assign expression";
LAB_0011d9a5:
    Error(this,s);
  }
  else if (etype == 3) {
    s = "\'base\' cannot be modified";
    goto LAB_0011d9a5;
  }
  Lex(this);
  Expression(this);
  if (uVar1 < 0x27) {
    if ((0x7000000300U >> (uVar1 & 0x3f) & 1) != 0) {
      EmitCompoundArith(this,tok,etype,SVar9);
      goto LAB_0011d9e6;
    }
    if (uVar1 != 0) goto LAB_0011da21;
    if ((etype & 0xfffffffffffffffe) != 2) {
      Error(this,"can\'t \'create\' a local slot");
      goto LAB_0011d9e6;
    }
    SVar11 = _OP_NEWSLOT;
  }
  else {
LAB_0011da21:
    if (tok != 0x3d) goto LAB_0011d9e6;
    if (1 < etype - 2) {
      if (etype == 5) {
        arg2 = SQFuncState::PopTarget(this->_fs);
        SVar10 = SQFuncState::PushTarget(this->_fs,-1);
        pSVar12 = this->_fs;
        SVar11 = _OP_SETOUTER;
      }
      else {
        if (etype != 4) goto LAB_0011d9e6;
        SVar9 = SQFuncState::PopTarget(this->_fs);
        SVar10 = SQFuncState::TopTarget(this->_fs);
        pSVar12 = this->_fs;
        SVar11 = _OP_MOVE;
        arg2 = 0;
      }
      SQFuncState::AddInstruction(pSVar12,SVar11,SVar10,SVar9,arg2,0);
      goto LAB_0011d9e6;
    }
    SVar11 = _OP_SET;
  }
  EmitDerefOp(this,SVar11);
LAB_0011d9e6:
  (this->_es).donot_get = bVar7;
  *(undefined7 *)&(this->_es).field_0x11 = uVar8;
  (this->_es).etype = SVar5;
  (this->_es).epos = SVar6;
  return;
}

Assistant:

void Expression()
    {
         SQExpState es = _es;
        _es.etype     = EXPR;
        _es.epos      = -1;
        _es.donot_get = false;
        LogicalOrExp();
        switch(_token)  {
        case _SC('='):
        case TK_NEWSLOT:
        case TK_MINUSEQ:
        case TK_PLUSEQ:
        case TK_MULEQ:
        case TK_DIVEQ:
        case TK_MODEQ:{
            SQInteger op = _token;
            SQInteger ds = _es.etype;
            SQInteger pos = _es.epos;
            if(ds == EXPR) Error(_SC("can't assign expression"));
            else if(ds == BASE) Error(_SC("'base' cannot be modified"));
            Lex(); Expression();

            switch(op){
            case TK_NEWSLOT:
                if(ds == OBJECT || ds == BASE)
                    EmitDerefOp(_OP_NEWSLOT);
                else //if _derefstate != DEREF_NO_DEREF && DEREF_FIELD so is the index of a local
                    Error(_SC("can't 'create' a local slot"));
                break;
            case _SC('='): //ASSIGN
                switch(ds) {
                case LOCAL:
                    {
                        SQInteger src = _fs->PopTarget();
                        SQInteger dst = _fs->TopTarget();
                        _fs->AddInstruction(_OP_MOVE, dst, src);
                    }
                    break;
                case OBJECT:
                case BASE:
                    EmitDerefOp(_OP_SET);
                    break;
                case OUTER:
                    {
                        SQInteger src = _fs->PopTarget();
                        SQInteger dst = _fs->PushTarget();
                        _fs->AddInstruction(_OP_SETOUTER, dst, pos, src);
                    }
                }
                break;
            case TK_MINUSEQ:
            case TK_PLUSEQ:
            case TK_MULEQ:
            case TK_DIVEQ:
            case TK_MODEQ:
                EmitCompoundArith(op, ds, pos);
                break;
            }
            }
            break;
        case _SC('?'): {
            Lex();
            _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
            SQInteger jzpos = _fs->GetCurrentPos();
            SQInteger trg = _fs->PushTarget();
            Expression();
            SQInteger first_exp = _fs->PopTarget();
            if(trg != first_exp) _fs->AddInstruction(_OP_MOVE, trg, first_exp);
            SQInteger endfirstexp = _fs->GetCurrentPos();
            _fs->AddInstruction(_OP_JMP, 0, 0);
            Expect(_SC(':'));
            SQInteger jmppos = _fs->GetCurrentPos();
            Expression();
            SQInteger second_exp = _fs->PopTarget();
            if(trg != second_exp) _fs->AddInstruction(_OP_MOVE, trg, second_exp);
            _fs->SetInstructionParam(jmppos, 1, _fs->GetCurrentPos() - jmppos);
            _fs->SetInstructionParam(jzpos, 1, endfirstexp - jzpos + 1);
            _fs->SnoozeOpt();
            }
            break;
        default:
            break;
        }
        _es = es;
    }